

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O2

void density_tests::heterogeneous_queue_consume_operation_samples(void)

{
  bool bVar1;
  QueueControl *__tmp;
  runtime_type<> *prVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int *piVar5;
  void *i_dest;
  difference_type dVar6;
  int *piVar7;
  consume_operation consume;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  type consume_1;
  consume_operation local_138;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_128;
  consume_operation local_118;
  consume_operation local_108;
  const_iterator local_f8;
  const_iterator local_d8;
  const_iterator local_b8;
  const_iterator local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  local_128.m_head = (ControlBlock *)0xffef;
  local_128.m_tail = (ControlBlock *)0xffef;
  local_138.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT44(local_138.m_queue._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_128,(int *)&local_138);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[13]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_128,(char (*) [13])"Hello world!");
  local_138.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       0x4045000000000000;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<double,double>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_128,(double *)&local_138);
  while( true ) {
    local_138.m_control =
         density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         start_consume_impl(&local_128);
    local_138.m_queue = &local_128;
    if (local_138.m_control == (ControlBlock *)0x0) break;
    prVar2 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type(&local_138);
    if (prVar2->m_feature_table ==
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Found an int: ");
      piVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>(&local_138);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar5);
LAB_00e85ed5:
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_138);
      if (prVar2->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
          ::s_table) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Found a string: ");
        pbVar4 = density::
                 heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                 consume_operation::element<std::__cxx11::string>((consume_operation *)&local_138);
        poVar3 = std::operator<<(poVar3,(string *)pbVar4);
        goto LAB_00e85ed5;
      }
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit(&local_138);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation(&local_138);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation(&local_138);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_128);
  local_128.m_head = (ControlBlock *)0xffef;
  local_128.m_tail = (ControlBlock *)0xffef;
  local_138.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT44(local_138.m_queue._4_4_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&local_128,(int *)&local_138);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[13]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_128,(char (*) [13])"Hello world!");
  local_138.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       0x4045000000000000;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<double,double>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &local_128,(double *)&local_138);
  local_138.m_control = (ControlBlock *)0x0;
  do {
    bVar1 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            try_start_consume(&local_128,&local_138);
    if (!bVar1) {
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_control = (ControlBlock *)0x0;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_118.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_control = (ControlBlock *)0x0;
      local_138.m_queue = &local_128;
      local_118.m_queue = &local_128;
      if (local_118.m_control == (ControlBlock *)0x0) {
        __assert_fail("consume.empty() && !consume_1.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,500,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue._0_4_ = 0x2a;
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2b);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_118.m_control = (ControlBlock *)0x0;
      local_138.m_queue = &local_128;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::operator=(&local_118,&local_138);
      if ((local_138.m_control != (ControlBlock *)0x0) ||
         (local_118.m_control == (ControlBlock *)0x0)) {
        __assert_fail("consume.empty() && !consume_1.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x202,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue._0_4_ = 0x2a;
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_108.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_108.m_queue = &local_128;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_108);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue._0_4_ = 0x2a;
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control = (ControlBlock *)0x0;
      local_118.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_118.m_queue = &local_128;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::operator=(&local_138,&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_118);
      if (local_138.m_control == (ControlBlock *)0x0) {
        __assert_fail("!consume.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x217,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue._0_4_ = 0x2a;
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control = (ControlBlock *)0x0;
      local_118.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_118.m_queue = &local_128;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::operator=(&local_138,&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control = (ControlBlock *)0x0;
      local_118.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_118.m_queue = &local_128;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::operator=(&local_138,&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_118);
      if ((local_138.m_control == (ControlBlock *)0x0) || (local_138.m_queue != &local_128)) {
        __assert_fail("!consume.empty() && !!consume && consume.queue() == &queue",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x22d,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<std::__cxx11::string,char_const(&)[4]>
                ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                 &local_128,(char (*) [4])"abc");
      local_138.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_queue = &local_128;
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_138);
      i_dest = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element_ptr(&local_138);
      density::runtime_type<>::destroy(prVar2,i_dest);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit_nodestroy(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_queue = &local_128;
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::cancel(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cbegin(&local_50,&local_128);
      local_b8.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)1> *)0x0;
      local_b8.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
      local_b8.m_control = (ControlBlock *)0x0;
      local_b8.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
      dVar6 = std::
              distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                        (&local_50,&local_b8);
      if (dVar6 != 1) {
        __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x245,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_queue = &local_128;
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_138);
      if (prVar2->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume.complete_type().is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x24e,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_138);
      if (prVar2->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume.complete_type() == runtime_type<>::make<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x251,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cbegin(&local_70,&local_128);
      local_d8.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)1> *)0x0;
      local_d8.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
      local_d8.m_control = (ControlBlock *)0x0;
      local_d8.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
      dVar6 = std::
              distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                        (&local_70,&local_d8);
      if (dVar6 != 0) {
        __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x254,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_queue = &local_128;
      piVar5 = (int *)density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::consume_operation::element_ptr(&local_138);
      *piVar5 = *piVar5 + 1;
      piVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>(&local_138);
      if (*piVar5 != 0x2b) {
        __assert_fail("consume.element<int>() == 43",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x25e,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_118.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_control = (ControlBlock *)0x0;
      local_138.m_queue = &local_128;
      local_118.m_queue = &local_128;
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_118);
      if (prVar2->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume_2.complete_type().is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x26d,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_118);
      if (prVar2->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        __assert_fail("consume_2.complete_type() == runtime_type<>::make<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x270,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      piVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>(&local_118);
      if (*piVar5 != 0x2a) {
        __assert_fail("consume_2.element<int>() == 42",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x271,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      cbegin(&local_90,&local_128);
      local_f8.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)1> *)0x0;
      local_f8.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
      local_f8.m_control = (ControlBlock *)0x0;
      local_f8.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
      dVar6 = std::
              distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                        (&local_90,&local_f8);
      if (dVar6 != 0) {
        __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x274,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_118);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_queue = &local_128;
      piVar5 = (int *)density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::consume_operation::unaligned_element_ptr(&local_138);
      piVar7 = (int *)density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::consume_operation::element_ptr(&local_138);
      if (piVar5 != piVar7) {
        __assert_fail("unaligned_ptr == consume.element_ptr()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x286,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      if (((ulong)piVar5 & 3) != 0) {
        __assert_fail("address_is_aligned(element_ptr, alignof(int))",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x289,"void density_tests::heterogeneous_queue_consume_operation_samples()");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"An int: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::~consume_operation(&local_138);
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      destroy(&local_128);
      local_128.m_head = (ControlBlock *)0xffef;
      local_128.m_tail = (ControlBlock *)0xffef;
      local_138.m_queue =
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           CONCAT44(local_138.m_queue._4_4_,0x2a);
      density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
      emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                        *)&local_128,(int *)&local_138);
      local_138.m_control =
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::start_consume_impl(&local_128);
      local_138.m_queue = &local_128;
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_138);
      if (prVar2->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
          ::s_table) {
        poVar3 = std::operator<<((ostream *)&std::cout,"An int: ");
        piVar5 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 consume_operation::element<int>(&local_138);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar5);
        std::endl<char,std::char_traits<char>>(poVar3);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        consume_operation::commit(&local_138);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        consume_operation::~consume_operation(&local_138);
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        destroy(&local_128);
        return;
      }
      __assert_fail("consume.complete_type().is<int>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x294,"void density_tests::heterogeneous_queue_consume_operation_samples()");
    }
    prVar2 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type(&local_138);
    if (prVar2->m_feature_table ==
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Found an int: ");
      piVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>(&local_138);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar5);
LAB_00e85fe6:
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      prVar2 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&local_138);
      if (prVar2->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
          ::s_table) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Found a string: ");
        pbVar4 = density::
                 heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                 consume_operation::element<std::__cxx11::string>((consume_operation *)&local_138);
        poVar3 = std::operator<<(poVar3,(string *)pbVar4);
        goto LAB_00e85fe6;
      }
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit(&local_138);
  } while( true );
}

Assistant:

void heterogeneous_queue_consume_operation_samples()
    {
        using namespace density;
        {

            //! [heter_queue consume_operation consume_1 example 1]
            heter_queue<> queue;
            queue.push(42);
            queue.emplace<std::string>("Hello world!");
            queue.push(42.);

            while (auto consume = queue.try_start_consume())
            {
                if (consume.complete_type().is<int>())
                    std::cout << "Found an int: " << consume.element<int>() << std::endl;
                else if (consume.complete_type().is<std::string>())
                    std::cout << "Found a string: " << consume.element<std::string>() << std::endl;
                consume.commit();
            }
            //! [heter_queue consume_operation consume_1 example 1]
        }
        {
            //! [heter_queue consume_operation consume_1 example 2]
            heter_queue<> queue;
            queue.push(42);
            queue.emplace<std::string>("Hello world!");
            queue.push(42.);

            heter_queue<>::consume_operation consume;
            while (queue.try_start_consume(consume))
            {
                if (consume.complete_type().is<int>())
                    std::cout << "Found an int: " << consume.element<int>() << std::endl;
                else if (consume.complete_type().is<std::string>())
                    std::cout << "Found a string: " << consume.element<std::string>() << std::endl;
                consume.commit();
            }
            //! [heter_queue consume_operation consume_1 example 2]
        }

        {
            heter_queue<> queue;
            //! [heter_queue consume_operation default_construct example 1]
            heter_queue<>::consume_operation consume;
            assert(consume.empty());
            //! [heter_queue consume_operation default_construct example 1]
        }

        //! [heter_queue consume_operation copy_construct example 1]
        static_assert(!std::is_copy_constructible<heter_queue<>::consume_operation>::value, "");
        //! [heter_queue consume_operation copy_construct example 1]

        //! [heter_queue consume_operation copy_assign example 1]
        static_assert(!std::is_copy_assignable<heter_queue<>::consume_operation>::value, "");
        //! [heter_queue consume_operation copy_assign example 1]

        {
            //! [heter_queue consume_operation move_construct example 1]
            heter_queue<> queue;

            queue.push(42);
            auto consume = queue.try_start_consume();

            auto consume_1 = std::move(consume);
            assert(consume.empty() && !consume_1.empty());
            consume_1.commit();
            //! [heter_queue consume_operation move_construct example 1]
        }
        {
            //! [heter_queue consume_operation move_assign example 1]
            heter_queue<> queue;

            queue.push(42);
            queue.push(43);
            auto consume = queue.try_start_consume();

            heter_queue<>::consume_operation consume_1;
            consume_1 = std::move(consume);
            assert(consume.empty() && !consume_1.empty());
            consume_1.commit();
            //! [heter_queue consume_operation move_assign example 1]
        }
        {
            //! [heter_queue consume_operation destroy example 1]
            heter_queue<> queue;
            queue.push(42);

            // this consumed is started and destroyed before being committed, so it has no observable effects
            queue.try_start_consume();
            //! [heter_queue consume_operation destroy example 1]
        }
        {
            //! [heter_queue consume_operation empty example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty());
            consume = queue.try_start_consume();
            assert(!consume.empty());
            //! [heter_queue consume_operation empty example 1]
        }
        {
            //! [heter_queue consume_operation operator_bool example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty() == !consume);
            consume = queue.try_start_consume();
            assert(consume.empty() == !consume);
            //! [heter_queue consume_operation operator_bool example 1]
        }
        {
            //! [heter_queue consume_operation queue example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty() && !consume && consume.queue() == nullptr);
            consume = queue.try_start_consume();
            assert(!consume.empty() && !!consume && consume.queue() == &queue);
            //! [heter_queue consume_operation queue example 1]
        }
        {
            //! [heter_queue consume_operation commit_nodestroy example 1]
            heter_queue<> queue;
            queue.emplace<std::string>("abc");

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            consume.complete_type().destroy(consume.element_ptr());

            // the string has already been destroyed. Calling commit would trigger an undefined behavior
            consume.commit_nodestroy();
            //! [heter_queue consume_operation commit_nodestroy example 1]
        }
        {
            //! [heter_queue consume_operation cancel example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            consume.cancel();

            // there is still a 42 in the queue
            assert(std::distance(queue.cbegin(), queue.cend()) == 1);
            //! [heter_queue consume_operation cancel example 1]
        }
        {
            //! [heter_queue consume_operation complete_type example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            assert(consume.complete_type().is<int>());
            assert(
              consume.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            consume.commit();

            assert(std::distance(queue.cbegin(), queue.cend()) == 0);
            //! [heter_queue consume_operation complete_type example 1]
        }
        {
            //! [heter_queue consume_operation element_ptr example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            ++*static_cast<int *>(consume.element_ptr());
            assert(consume.element<int>() == 43);
            consume.commit();
            //! [heter_queue consume_operation element_ptr example 1]
        }
        {
            //! [heter_queue consume_operation swap example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume_1 = queue.try_start_consume();
            heter_queue<>::consume_operation consume_2;
            {
                using namespace std;
                swap(consume_1, consume_2);
            }
            assert(consume_2.complete_type().is<int>());
            assert(
              consume_2.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            assert(consume_2.element<int>() == 42);
            consume_2.commit();

            assert(std::distance(queue.cbegin(), queue.cend()) == 0);
            //! [heter_queue consume_operation swap example 1]
        }
        {
            //! [heter_queue consume_operation unaligned_element_ptr example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            bool const   is_overaligned              = alignof(int) > heter_queue<>::min_alignment;
            void * const unaligned_ptr               = consume.unaligned_element_ptr();
            int *        element_ptr;
            if (is_overaligned)
            {
                element_ptr = static_cast<int *>(address_upper_align(unaligned_ptr, alignof(int)));
            }
            else
            {
                assert(unaligned_ptr == consume.element_ptr());
                element_ptr = static_cast<int *>(unaligned_ptr);
            }
            assert(address_is_aligned(element_ptr, alignof(int)));
            std::cout << "An int: " << *element_ptr << std::endl;
            consume.commit();
            //! [heter_queue consume_operation unaligned_element_ptr example 1]
        }
        {
            //! [heter_queue consume_operation element example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            assert(consume.complete_type().is<int>());
            std::cout << "An int: " << consume.element<int>() << std::endl;
            /* std::cout << "An float: " << consume.element<float>() << std::endl; this would
        trigger an undefined behavior, because the element is not a float */
            consume.commit();
            //! [heter_queue consume_operation element example 1]
        }
    }